

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::arg_list(analysis *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  analysis *in_RSI;
  NodePtr NVar3;
  NodePtr local_98;
  undefined1 local_88 [40];
  pointer local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  local_88._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[3],int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->current_tab,(TreeNode **)this,
             (allocator<dh::TreeNode> *)&local_98,(char (*) [3])0x12b384,(int *)local_88);
  local_48.field_2._M_allocated_capacity._0_2_ = 0x28;
  local_48._M_string_length = 1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  match(in_RSI,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  token::getVal_abi_cxx11_
            ((string *)local_88,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar1 = std::__cxx11::string::compare(local_88);
  if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_));
  }
  if (iVar1 != 0) {
    proper_arg_list((analysis *)local_88);
    local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(local_88._4_4_,local_88._0_4_);
    local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  }
  TreeNode::appendChild(*(TreeNode **)this,&local_98);
  local_58._M_allocated_capacity._0_2_ = 0x29;
  local_60 = (pointer)0x1;
  local_88._32_8_ = &local_58;
  match(in_RSI,(string *)(local_88 + 0x20));
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._32_8_ != &local_58) {
    operator_delete((void *)local_88._32_8_);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::arg_list()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in arg_list\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("()",tmp->getLineno());
	match("(");
	NodePtr tmp_ptr = nullptr;
	if ( tmp->getVal() != ")")
	{
		tmp_ptr = proper_arg_list();
	}
	ret->appendChild(tmp_ptr);
	match(")");
	return ret;
}